

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CheckIfTargetInLOS
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double dVar4;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 t1;
  PClass *pPVar5;
  bool bVar6;
  PClass *pPVar7;
  VMValue *pVVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar9;
  char *pcVar10;
  int iVar11;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 this;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar12;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 t2;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uint uVar16;
  double dVar17;
  FTranslatedLineTarget t;
  undefined1 local_68 [16];
  DAngle local_58;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_50 [4];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
LAB_003d6e39:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1095,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d6e39;
  }
  this = *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&param->field_0;
  if (this != (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0) {
    if (*(PClass **)((long)this + 8) == (PClass *)0x0) {
      pPVar7 = (PClass *)(*(code *)**(undefined8 **)this)(this.p);
      *(PClass **)((long)this + 8) = pPVar7;
    }
    pPVar7 = *(PClass **)((long)this + 8);
    bVar13 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar5 && bVar13) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar5) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar13) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d6e39;
    }
  }
  if (numparam == 1) {
    pVVar8 = defaultparam->Array;
    if (defaultparam->Array[1].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d6e77:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1096,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    pVVar8 = param;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d6e77;
    }
  }
  uVar14 = (undefined4)*(undefined8 *)&pVVar8[1].field_0;
  uVar15 = (undefined4)((ulong)*(undefined8 *)&pVVar8[1].field_0 >> 0x20);
  if (numparam < 3) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[2].field_0.field_3.Type != '\0') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d6e96;
    }
  }
  else {
    pVVar8 = param;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003d6e96:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1097,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  uVar3 = pVVar8[2].field_0.i;
  if (numparam < 4) {
    pVVar8 = defaultparam->Array;
    if (pVVar8[3].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d6eb5;
    }
  }
  else {
    pVVar8 = param;
    if (param[3].field_0.field_3.Type != '\x01') {
      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d6eb5:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1098,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  dVar1 = pVVar8[3].field_0.f;
  if (numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d6ed4;
    }
  }
  else if (param[4].field_0.field_3.Type != '\x01') {
    pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d6ed4:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1099,
                  "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  dVar2 = param[4].field_0.f;
  if (*(player_t **)((long)this + 0x230) == (player_t *)0x0) {
    if ((uVar3 & 0x40) == 0) {
      if (((uVar3 & 1) == 0 || (*(byte *)((long)this + 0x1be) & 1) == 0) && ((uVar3 & 0x1000) == 0))
      {
        local_50[0] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                      ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(this.o + 0xd))->p;
        if ((local_50[0].p != (AActor *)0x0) &&
           ((((local_50[0].p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          paVar9 = &((this.p)->target).field_0;
          goto LAB_003d6a90;
        }
      }
      else {
        if ((((this.p)->flags2).Value & 0x40000000) == 0 && (uVar3 & 0x1000) == 0)
        goto LAB_003d6ade;
        local_50[0] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                      *(anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&this.o[0xf].ObjectFlags;
        if ((local_50[0].p != (AActor *)0x0) &&
           ((((local_50[0].p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          paVar9 = &((this.p)->tracer).field_0;
          goto LAB_003d6a90;
        }
      }
    }
    else {
      local_50[0] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                    ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)(this.o + 0x10))->p;
      if ((local_50[0].p != (AActor *)0x0) &&
         ((((local_50[0].p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        paVar9 = &((this.p)->master).field_0;
LAB_003d6a90:
        paVar9->p = (AActor *)0x0;
LAB_003d6ade:
        local_50[0].p = (AActor *)0x0;
      }
    }
    if (local_50[0].p == (AActor *)0x0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10b4,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      if (((uVar3 & 0x20) == 0) || (0 < (local_50[0].p)->health)) goto LAB_003d6afe;
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10b8,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    goto LAB_003d6df6;
  }
  local_68._8_8_ = ((Angle *)((long)this + 0xb0))->Degrees;
  uVar16 = 0;
  if ((uVar3 >> 0xb & 1) != 0) {
    uVar16 = 0x3fe00000;
  }
  local_58.Degrees = (double)((ulong)uVar16 << 0x20);
  P_AimLineAttack((AActor *)local_68,(DAngle *)this.p,2048.0,(FTranslatedLineTarget *)(local_68 + 8)
                  ,(DAngle *)local_50,(int)&local_58,(AActor *)&DAT_00000020,(AActor *)0x0);
  if (local_50[0].p == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10c4,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    goto LAB_003d6df6;
  }
  aVar12 = local_50[0];
  switch(uVar3 >> 7 & 3) {
  case 0:
    uVar14 = 0;
    uVar15 = 0;
    bVar13 = false;
    break;
  case 1:
    goto LAB_003d6afe;
  case 2:
    bVar13 = false;
    break;
  case 3:
    uVar14 = 0;
    uVar15 = 0;
LAB_003d6afe:
    bVar13 = (uVar3 & 2) == 0;
    aVar12 = local_50[0];
  }
  if ((((uVar3 >> 10 & 1) == 0) || ((aVar12.p)->player != (player_t *)0x0)) ||
     ((((aVar12.p)->flags3).Value & 0x2000) != 0)) {
    dVar17 = (double)CONCAT44(uVar15,uVar14);
    if (((uVar3 >> 9 & 1) == 0) || (bVar6 = AActor::IsFriend(this.p,aVar12.p), !bVar6)) {
      dVar4 = AActor::Distance3D(this.p,aVar12.p,false);
      if (((dVar1 == 0.0) && (!NAN(dVar1))) || (dVar4 <= dVar1)) {
        if (((dVar2 != 0.0) || (NAN(dVar2))) && (dVar4 < dVar2)) {
          if ((uVar3 & 0x10) != 0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x10ef,
                            "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            goto LAB_003d6df6;
          }
          if ((uVar3 & 4) != 0) {
            dVar17 = 0.0;
          }
          bVar13 = (bool)(bVar13 & (uVar3 & 8) == 0);
        }
        t2 = aVar12;
        t1 = this;
        if ((char)uVar3 < '\0') {
          t2 = this;
          t1 = aVar12;
        }
        if ((!bVar13) || (bVar13 = P_CheckSight(t1.p,t2.p,1), bVar13)) {
          if (360.0 <= dVar17) {
            dVar17 = 360.0;
          }
          if (0.0 < dVar17) {
            if (t1.p == this.p) {
              this = t2;
            }
            if ((uVar3 >> 8 & 1) == 0) {
              this = t1;
              t1 = t2;
            }
            iVar11 = 0;
            AActor::AngleTo((AActor *)local_68,this.p,t1._0_1_);
            dVar1 = ABS((double)SUB84(((double)local_68._0_8_ - ((this.p)->Angles).Yaw.Degrees) *
                                      11930464.711111112 + 6755399441055744.0,0) *
                        8.381903171539307e-08);
            if ((dVar17 * 0.5 < dVar1) && (0 < numret)) {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x110e,
                              "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (ret->RegType != '\0') goto LAB_003d6e51;
              *(undefined4 *)ret->Location = 0;
              iVar11 = 1;
            }
            if (dVar17 * 0.5 < dVar1) {
              return iVar11;
            }
          }
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1111,
                          "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          uVar14 = 1;
          if (ret->RegType != '\0') goto LAB_003d6e51;
          goto LAB_003d6dfe;
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x10fd,
                        "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x10e9,
                        "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
    }
    else {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x10e3,
                      "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
  }
  else {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x10de,
                    "int AF_AActor_CheckIfTargetInLOS(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
LAB_003d6df6:
  if (ret->RegType != '\0') {
LAB_003d6e51:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  uVar14 = 0;
LAB_003d6dfe:
  *(undefined4 *)ret->Location = uVar14;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckIfTargetInLOS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_ANGLE_DEF	(fov)		
	PARAM_INT_DEF	(flags)		
	PARAM_FLOAT_DEF	(dist_max)	
	PARAM_FLOAT_DEF	(dist_close)

	AActor *target, *viewport;
	FTranslatedLineTarget t;

	bool doCheckSight;

	if (!self->player)
	{
		if (flags & JLOSF_CHECKMASTER)
		{
			target = self->master;
		}
		else if ((self->flags & MF_MISSILE && (flags & JLOSF_PROJECTILE)) || (flags & JLOSF_CHECKTRACER))
		{
			if ((self->flags2 & MF2_SEEKERMISSILE) || (flags & JLOSF_CHECKTRACER))
				target = self->tracer;
			else
				target = NULL;
		}
		else
		{
			target = self->target;
		}

		if (target == NULL)
		{ // [KS] Let's not call P_CheckSight unnecessarily in this case.
			ACTION_RETURN_BOOL(false);
		}
		if ((flags & JLOSF_DEADNOJUMP) && (target->health <= 0))
		{
			ACTION_RETURN_BOOL(false);
		}

		doCheckSight = !(flags & JLOSF_NOSIGHT);
	}
	else
	{
		// Does the player aim at something that can be shot?
		P_AimLineAttack(self, self->Angles.Yaw, MISSILERANGE, &t, (flags & JLOSF_NOAUTOAIM) ? 0.5 : 0., ALF_PORTALRESTRICT);
		
		if (!t.linetarget)
		{
			ACTION_RETURN_BOOL(false);
		}
		target = t.linetarget;

		switch (flags & (JLOSF_TARGETLOS|JLOSF_FLIPFOV))
		{
		case JLOSF_TARGETLOS|JLOSF_FLIPFOV:
			// target makes sight check, player makes fov check; player has verified fov
			fov = 0.;
			// fall-through
		case JLOSF_TARGETLOS:
			doCheckSight = !(flags & JLOSF_NOSIGHT); // The target is responsible for sight check and fov
			break;
		default:
			// player has verified sight and fov
			fov = 0.;
			// fall-through
		case JLOSF_FLIPFOV: // Player has verified sight, but target must verify fov
			doCheckSight = false;
			break;
		}
	}

	// [FDARI] If target is not a combatant, don't jump
	if ( (flags & JLOSF_COMBATANTONLY) && (!target->player) && !(target->flags3 & MF3_ISMONSTER))
	{
		ACTION_RETURN_BOOL(false);
	}
	// [FDARI] If actors share team, don't jump
	if ((flags & JLOSF_ALLYNOJUMP) && self->IsFriend(target))
	{
		ACTION_RETURN_BOOL(false);
	}
	double distance = self->Distance3D(target);

	if (dist_max && (distance > dist_max))
	{
		ACTION_RETURN_BOOL(false);
	}
	if (dist_close && (distance < dist_close))
	{
		if (flags & JLOSF_CLOSENOJUMP)
		{
			ACTION_RETURN_BOOL(false);
		}
		if (flags & JLOSF_CLOSENOFOV)
			fov = 0.;

		if (flags & JLOSF_CLOSENOSIGHT)
			doCheckSight = false;
	}

	if (flags & JLOSF_TARGETLOS) { viewport = target; target = self; }
	else { viewport = self; }

	if (doCheckSight && !P_CheckSight (viewport, target, SF_IGNOREVISIBILITY))
	{
		ACTION_RETURN_BOOL(false);
	}

	if (flags & JLOSF_FLIPFOV)
	{
		if (viewport == self) { viewport = target; target = self; }
		else { target = viewport; viewport = self; }
	}

	fov = MIN<DAngle>(fov, 360.);

	if (fov > 0)
	{
		DAngle an = absangle(viewport->AngleTo(target), viewport->Angles.Yaw);

		if (an > (fov / 2))
		{
			ACTION_RETURN_BOOL(false); // [KS] Outside of FOV - return
		}
	}
	ACTION_RETURN_BOOL(true);
}